

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

vector<absl::string_view,_std::allocator<absl::string_view>_> * __thiscall
s2textformat::SplitString
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          s2textformat *this,string_view str,char separator)

{
  bool bVar1;
  reference psVar2;
  string_view sVar3;
  string_view *e;
  iterator __end1;
  iterator __begin1;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1;
  SkipWhitespace local_49;
  function<bool_(absl::string_view)> local_48;
  undefined1 local_22;
  char local_21;
  undefined1 auStack_20 [7];
  char separator_local;
  string_view str_local;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *result;
  
  str_local.ptr_ = str.ptr_;
  local_22 = 0;
  local_21 = (char)str.length_;
  _auStack_20 = this;
  str_local.length_ = (size_type)__return_storage_ptr__;
  std::function<bool(absl::string_view)>::function<absl::SkipWhitespace,void>
            ((function<bool(absl::string_view)> *)&local_48,&local_49);
  absl::StrSplit<absl::string_view>
            (__return_storage_ptr__,(string_view *)auStack_20,(char)str.length_,&local_48);
  std::function<bool_(absl::string_view)>::~function(&local_48);
  __end1 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::begin
                     (__return_storage_ptr__);
  e = (string_view *)
      std::vector<absl::string_view,_std::allocator<absl::string_view>_>::end
                (__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
                                     *)&e), bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
             ::operator*(&__end1);
    sVar3 = absl::StripAsciiWhitespace(*psVar2);
    *psVar2 = sVar3;
    __gnu_cxx::
    __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<string_view> SplitString(string_view str, char separator) {
  vector<string_view> result =
      absl::StrSplit(str, separator, absl::SkipWhitespace());
  for (auto& e : result) {
    e = absl::StripAsciiWhitespace(e);
  }
  return result;
}